

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O0

void Res_SimDeriveInfoReplicate(Res_Sim_t *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  int local_34;
  int local_30;
  int w;
  int j;
  int i;
  Abc_Obj_t *pObj;
  uint *pInfo2;
  uint *pInfo;
  Res_Sim_t *p_local;
  
  for (w = 0; iVar1 = Abc_NtkPoNum(p->pAig), w < iVar1; w = w + 1) {
    pAVar2 = Abc_NtkPo(p->pAig,w);
    pvVar3 = Vec_PtrEntry(p->vPats,pAVar2->Id);
    pObj = (Abc_Obj_t *)Vec_PtrEntry(p->vOuts,w);
    for (local_30 = 0; local_30 < p->nPats; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < p->nWords; local_34 = local_34 + 1) {
        *(undefined4 *)&pObj->pNtk = *(undefined4 *)((long)pvVar3 + (long)local_34 * 4);
        pObj = (Abc_Obj_t *)((long)&pObj->pNtk + 4);
      }
    }
  }
  return;
}

Assistant:

void Res_SimDeriveInfoReplicate( Res_Sim_t * p )
{
    unsigned * pInfo, * pInfo2;
    Abc_Obj_t * pObj;
    int i, j, w;
    Abc_NtkForEachPo( p->pAig, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( p->vPats, pObj->Id );
        pInfo2 = (unsigned *)Vec_PtrEntry( p->vOuts, i );
        for ( j = 0; j < p->nPats; j++ )
            for ( w = 0; w < p->nWords; w++ )
                *pInfo2++ = pInfo[w];
    }
}